

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::draw(Board *this,RenderTarget *target,RenderStates states)

{
  VertexArray *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  repr rVar3;
  bool bVar4;
  int iVar5;
  DebugScreen *pDVar6;
  Chunk *pCVar7;
  Vertex *pVVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  difference_type __d;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  Board *pBVar15;
  RenderStates *pRVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  int iVar19;
  size_t index;
  Color CVar20;
  int iVar21;
  byte bVar22;
  float fVar23;
  float fVar24;
  RenderStates states2;
  RenderStates in_stack_fffffffffffffe98;
  pointer local_e8;
  string local_d0;
  Board *local_b0;
  RenderTarget *local_a8;
  ulong local_a0;
  undefined8 local_98 [3];
  Transform local_80;
  
  bVar22 = 0;
  iVar5 = LodRenderer::getLevelOfDetail(&this->super_LodRenderer);
  sf::RenderTarget::draw
            (target,(Drawable *)(&(this->chunkRenderCache_).field_0x0 + (long)iVar5 * 0x2f8),&states
            );
  pRVar16 = &states;
  puVar17 = local_98;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar17 = *(undefined8 *)&pRVar16->blendMode;
    pRVar16 = (RenderStates *)((long)pRVar16 + (ulong)bVar22 * -0x10 + 8);
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
  }
  uVar1 = (this->lastVisibleArea_).left;
  uVar2 = (this->lastVisibleArea_).top;
  local_d0._M_dataplus._M_p =
       (pointer)CONCAT44((float)((uVar2 - (int)(this->lastTopLeft_ >> 0x20)) * 0x400),
                         (float)((uVar1 - (int)this->lastTopLeft_) * 0x400));
  local_b0 = this;
  sf::Transform::translate(&local_80,(Vector2f *)&local_d0);
  puVar17 = local_98;
  puVar18 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar18 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
  }
  local_a8 = target;
  LodRenderer::drawDecorations
            (&this->super_LodRenderer,target,in_stack_fffffffffffffe98,&this->lastVisibleArea_);
  pDVar6 = DebugScreen::instance();
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Board::draw draw_debug","");
  DebugScreen::profilerEvent(pDVar6,&local_d0);
  pBVar15 = local_b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (((pBVar15->debugDrawChunkBorder_ == true) &&
      (iVar5 = (pBVar15->lastVisibleArea_).width, 0 < iVar5)) &&
     (iVar9 = (pBVar15->lastVisibleArea_).height, 0 < iVar9)) {
    this_00 = &pBVar15->debugChunkBorder_;
    sf::VertexArray::resize(this_00,(ulong)(uint)(iVar5 * iVar9 * 4));
    if (0 < (pBVar15->lastVisibleArea_).height) {
      rVar3 = pBVar15->lastTopLeft_;
      iVar5 = (pBVar15->lastVisibleArea_).left;
      local_a0 = (ulong)((pBVar15->lastVisibleArea_).top + ((uint)(rVar3 >> 0x20) ^ 0x7fffffff) + 1)
      ;
      iVar9 = 0;
      index = 0;
      do {
        local_e8 = (pBVar15->chunkDrawables_).vec_.
                   super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(pBVar15->chunkDrawables_).vec_.
                       super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_e8;
        if (0 < (long)uVar11) {
          uVar11 = (uVar11 >> 5) * -0x5555555555555555;
          do {
            uVar12 = uVar11 >> 1;
            uVar13 = uVar12;
            if (local_e8[uVar12].first <=
                (CONCAT44((pBVar15->lastVisibleArea_).top + iVar9,
                          (pBVar15->lastVisibleArea_).left + -1) | 0x8000000080000000)) {
              uVar13 = ~uVar12 + uVar11;
              local_e8 = local_e8 + uVar12 + 1;
            }
            uVar11 = uVar13;
          } while (0 < (long)uVar13);
        }
        if (0 < (pBVar15->lastVisibleArea_).width) {
          fVar23 = (float)(((int)local_a0 + iVar9) * 0x400);
          iVar14 = 0;
          iVar21 = (((uint)rVar3 ^ 0x7fffffff) + iVar5) * 0x400;
          do {
            iVar21 = iVar21 + 0x400;
            CVar20.r = '\0';
            CVar20.g = '\0';
            CVar20.b = 0xff;
            CVar20.a = 0xff;
            if ((local_e8 !=
                 (pBVar15->chunkDrawables_).vec_.
                 super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (local_e8->first ==
                (CONCAT44((pBVar15->lastVisibleArea_).top + iVar9,
                          (pBVar15->lastVisibleArea_).left + iVar14) | 0x8000000080000000))) {
              pCVar7 = ChunkDrawable::getChunk(&local_e8->second);
              if (pCVar7 == (Chunk *)0x0) {
                CVar20.r = '\0';
                CVar20.g = 0xff;
                CVar20.b = 0xff;
                CVar20.a = 0xff;
              }
              else {
                pCVar7 = ChunkDrawable::getChunk(&local_e8->second);
                bVar4 = Chunk::isUnsaved(pCVar7);
                if (bVar4) {
                  sf::Color::Color((Color *)&local_d0,0xff,'\x7f','\0',0xff);
                }
                else {
                  local_d0._M_dataplus._M_p._0_4_ = (Color)0xff00ffff;
                }
                CVar20 = local_d0._M_dataplus._M_p._0_4_;
              }
              local_e8 = local_e8 + 1;
            }
            fVar24 = (float)iVar21;
            iVar19 = (int)index;
            pVVar8 = sf::VertexArray::operator[](this_00,index);
            (pVVar8->position).x = fVar24;
            (pVVar8->position).y = fVar23;
            pVVar8 = sf::VertexArray::operator[](this_00,index);
            pVVar8->color = CVar20;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 1));
            (pVVar8->position).x = fVar24 + 1024.0;
            (pVVar8->position).y = fVar23;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 1));
            pVVar8->color = CVar20;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 2));
            (pVVar8->position).x = fVar24;
            (pVVar8->position).y = fVar23;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 2));
            pVVar8->color = CVar20;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 3));
            (pVVar8->position).x = fVar24;
            (pVVar8->position).y = fVar23 + 1024.0;
            pVVar8 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 3));
            pVVar8->color = CVar20;
            index = (size_t)(iVar19 + 4);
            iVar14 = iVar14 + 1;
            pBVar15 = local_b0;
          } while (iVar14 < (local_b0->lastVisibleArea_).width);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (pBVar15->lastVisibleArea_).height);
    }
    sf::RenderTarget::draw(local_a8,&this_00->super_Drawable,&states);
  }
  pDVar6 = DebugScreen::instance();
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Board::draw draw_debug_done","");
  DebugScreen::profilerEvent(pDVar6,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Board::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    target.draw(chunkRenderCache_[getLevelOfDetail()], states);

    sf::RenderStates states2 = states;
    states2.transform.translate(static_cast<sf::Vector2f>(
        sf::Vector2i(
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        ) * Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS)
    ));
    drawDecorations(target, states2, lastVisibleArea_);

    DebugScreen::instance()->profilerEvent("Board::draw draw_debug");
    if (debugDrawChunkBorder_ && lastVisibleArea_.width > 0 && lastVisibleArea_.height > 0) {
        debugChunkBorder_.resize(lastVisibleArea_.width * lastVisibleArea_.height * 4);
        constexpr int chunkWidthTexels = Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS);
        const sf::Vector2i positionOffset = {
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        };

        unsigned int i = 0;
        for (int y = 0; y < lastVisibleArea_.height; ++y) {
            auto chunkDrawable = chunkDrawables_.upper_bound(ChunkCoords::pack(lastVisibleArea_.left - 1, lastVisibleArea_.top + y));
            float yChunkPos = static_cast<float>((y + positionOffset.y) * chunkWidthTexels);
            for (int x = 0; x < lastVisibleArea_.width; ++x) {
                float xChunkPos = static_cast<float>((x + positionOffset.x) * chunkWidthTexels);
                sf::Color borderColor = sf::Color::Blue;
                if (chunkDrawable != chunkDrawables_.end() && chunkDrawable->first == ChunkCoords::pack(lastVisibleArea_.left + x, lastVisibleArea_.top + y)) {
                    if (chunkDrawable->second.getChunk() != nullptr) {
                        borderColor = (chunkDrawable->second.getChunk()->isUnsaved() ? sf::Color(255, 127, 0) : sf::Color::Yellow);
                    } else {
                        borderColor = sf::Color::Cyan;
                    }
                    ++chunkDrawable;
                }

                debugChunkBorder_[i + 0].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 0].color = borderColor;
                debugChunkBorder_[i + 1].position = {xChunkPos + chunkWidthTexels, yChunkPos};
                debugChunkBorder_[i + 1].color = borderColor;
                debugChunkBorder_[i + 2].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 2].color = borderColor;
                debugChunkBorder_[i + 3].position = {xChunkPos, yChunkPos + chunkWidthTexels};
                debugChunkBorder_[i + 3].color = borderColor;
                i += 4;
            }
        }
        target.draw(debugChunkBorder_, states);
    }
    DebugScreen::instance()->profilerEvent("Board::draw draw_debug_done");
}